

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void startCapture(CaptureBody *capture)

{
  LexerState *pLVar1;
  char *pcVar2;
  
  pLVar1 = lexerState;
  if (lexerState->capturing == true) {
    __assert_fail("!lexerState->capturing",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x990,"startCapture");
  }
  lexerState->capturing = true;
  pLVar1->captureSize = 0;
  pLVar1->disableMacroArgs = true;
  pLVar1->disableInterpolation = true;
  capture->lineNo = pLVar1->lineNo;
  if ((pLVar1->isMmapped == true) && (pLVar1->expansions == (Expansion *)0x0)) {
    pcVar2 = (pLVar1->field_2).field_0.ptr + (pLVar1->field_2).field_0.offset;
  }
  else {
    pLVar1->captureCapacity = 0x80;
    if (pLVar1->captureBuf != (char *)0x0) {
      __assert_fail("lexerState->captureBuf == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x99c,"startCapture");
    }
    reallocCaptureBuf();
    pcVar2 = (char *)0x0;
  }
  capture->body = pcVar2;
  return;
}

Assistant:

static void startCapture(struct CaptureBody *capture)
{
	assert(!lexerState->capturing);
	lexerState->capturing = true;
	lexerState->captureSize = 0;
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	capture->lineNo = lexer_GetLineNo();

	if (lexerState->isMmapped && !lexerState->expansions) {
		capture->body = &lexerState->ptr[lexerState->offset];
	} else {
		lexerState->captureCapacity = 128; // The initial size will be twice that
		assert(lexerState->captureBuf == NULL);
		reallocCaptureBuf();
		capture->body = NULL; // Indicate to retrieve the capture buffer when done capturing
	}
}